

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.hpp
# Opt level: O2

void __thiscall OpenMD::OpenMDBitSet::flip(OpenMDBitSet *this,size_t bitIndex)

{
  ulong *puVar1;
  ulong uVar2;
  reference rVar3;
  reference rVar4;
  
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->bitset_,bitIndex);
  uVar2 = *rVar3._M_p;
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->bitset_,bitIndex);
  puVar1 = rVar4._M_p;
  if ((uVar2 & rVar3._M_mask) == 0) {
    uVar2 = rVar4._M_mask | *puVar1;
  }
  else {
    uVar2 = ~rVar4._M_mask & *puVar1;
  }
  *puVar1 = uVar2;
  return;
}

Assistant:

void flip(size_t bitIndex) { bitset_[bitIndex] = !bitset_[bitIndex]; }